

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O0

int64_t __thiscall
BamTools::Internal::TcpSocketEngine::Write(TcpSocketEngine *this,char *data,size_t length)

{
  bool bVar1;
  size_t in_RDX;
  char *in_RSI;
  TcpSocketEngine *in_RDI;
  TcpSocketEngine *this_00;
  int64_t local_8;
  
  this_00 = in_RDI;
  bVar1 = IsValid(in_RDI);
  if ((bVar1) && (in_RDI->m_socketState == ConnectedState)) {
    local_8 = nativeWrite(this_00,in_RSI,in_RDX);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

int64_t TcpSocketEngine::Write(const char* data, std::size_t length)
{

    // return failure if can't write
    if (!IsValid() || (m_socketState != TcpSocket::ConnectedState)) {
        // TODO: set error string
        return -1;
    }

    // otherwise return number of bytes written
    return nativeWrite(data, length);
}